

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>::set_host_name
          (ssl_stream<libtorrent::aux::utp_stream> *this,string *name)

{
  error_code ec_00;
  bool bVar1;
  system_error local_68;
  undefined1 auStack_28 [8];
  error_code ec;
  string *name_local;
  ssl_stream<libtorrent::aux::utp_stream> *this_local;
  
  ec.cat_ = (error_category *)name;
  boost::system::error_code::error_code((error_code *)auStack_28);
  set_host_name(this,(string *)ec.cat_,(error_code *)auStack_28);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return;
  }
  ec_00.cat_ = (error_category *)ec._0_8_;
  ec_00.val_ = auStack_28._0_4_;
  ec_00.failed_ = (bool)auStack_28[4];
  ec_00._5_3_ = auStack_28._5_3_;
  boost::system::system_error::system_error(&local_68,ec_00);
  boost::throw_exception<boost::system::system_error>(&local_68);
}

Assistant:

void set_host_name(std::string const& name)
	{
		error_code ec;
		set_host_name(name, ec);
		if (ec) boost::throw_exception(boost::system::system_error(ec));
	}